

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::exportAdditionalFrame
               (string *frame_name,Transform *link_H_frame,string *link_name,
               exportAdditionalFrameDirectionOption direction_option,xmlNodePtr parent_element)

{
  undefined8 uVar1;
  xmlNodePtr parent_element_00;
  undefined8 in_R9;
  string parent_of_fake_joint;
  string child_of_fake_joint;
  string fake_joint_name;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = xmlNewChild(parent_element,0,"link",0,parent_element,in_R9,link_name);
  xmlNewProp(uVar1,"name",(frame_name->_M_dataplus)._M_p);
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,"joint",0);
  std::operator+(&local_50,frame_name,"_fixed_joint");
  xmlNewProp(parent_element_00,"name",local_50._M_dataplus._M_p);
  xmlNewProp(parent_element_00,"type","fixed");
  exportTransform(link_H_frame,parent_element_00);
  local_90 = local_80;
  local_88 = 0;
  local_70 = local_60;
  local_68 = 0;
  local_80[0] = 0;
  local_60[0] = 0;
  if (direction_option == FAKE_LINK_IS_CHILD) {
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  std::__cxx11::string::_M_assign((string *)&local_70);
  uVar1 = xmlNewChild(parent_element_00,0,"parent",0);
  xmlNewProp(uVar1,"link",local_90);
  uVar1 = xmlNewChild(parent_element_00,0,"child",0);
  xmlNewProp(uVar1,"link",local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool exportAdditionalFrame(const std::string frame_name, Transform link_H_frame, const std::string link_name, exportAdditionalFrameDirectionOption direction_option, xmlNodePtr parent_element)
{
    bool ok=true;

    // Export fake link
    xmlNodePtr link_xml = xmlNewChild(parent_element, NULL, BAD_CAST "link", NULL);
    xmlNewProp(link_xml, BAD_CAST "name", BAD_CAST frame_name.c_str());

    // Export fake joint
    xmlNodePtr joint_xml = xmlNewChild(parent_element, NULL, BAD_CAST "joint", NULL);
    std::string fake_joint_name = frame_name + "_fixed_joint";
    xmlNewProp(joint_xml, BAD_CAST "name", BAD_CAST fake_joint_name.c_str());
    xmlNewProp(joint_xml, BAD_CAST "type", BAD_CAST "fixed");

    // origin
    exportTransform(link_H_frame, joint_xml);

    std::string parent_of_fake_joint, child_of_fake_joint;

    if (direction_option == FAKE_LINK_IS_CHILD) {
        parent_of_fake_joint = link_name;
        child_of_fake_joint = frame_name;
    } else {
        // direction_option == FAKE_LINK_IS_PARENT
        parent_of_fake_joint = frame_name;
        child_of_fake_joint = link_name;
    }

    // parent
    xmlNodePtr parent_xml = xmlNewChild(joint_xml, NULL, BAD_CAST "parent", NULL);
    xmlNewProp(parent_xml, BAD_CAST "link", BAD_CAST parent_of_fake_joint.c_str());

    // child
    xmlNodePtr child_xml = xmlNewChild(joint_xml, NULL, BAD_CAST "child", NULL);
    xmlNewProp(child_xml, BAD_CAST "link", BAD_CAST child_of_fake_joint.c_str());

    return ok;
}